

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::set<char,std::less<char>,std::allocator<char>>,std::set<char,std::less<char>,std::allocator<char>>>
          (String *__return_storage_ptr__,detail *this,
          set<char,_std::less<char>,_std::allocator<char>_> *lhs,char *op,
          set<char,_std::less<char>,_std::allocator<char>_> *rhs)

{
  String local_70;
  String local_58;
  String local_40;
  String local_28;
  
  String::String(&local_40,"{?}");
  String::String(&local_58,(char *)lhs);
  doctest::operator+(&local_28,&local_40,&local_58);
  String::String(&local_70,"{?}");
  doctest::operator+(__return_storage_ptr__,&local_28,&local_70);
  String::~String(&local_70);
  String::~String(&local_28);
  String::~String(&local_58);
  String::~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }